

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_raw_set_fixed_value(parser_info *info)

{
  int iVar1;
  
  iVar1 = decode_escaped_string(info->node->char_data);
  if (iVar1 < 0) {
    coda_set_error(-400,"invalid escape sequence in string");
LAB_00155c17:
    iVar1 = -1;
  }
  else {
    if (iVar1 != 0) {
      iVar1 = coda_type_raw_set_fixed_value
                        ((coda_type_raw *)info->node->parent->data,(long)iVar1,info->node->char_data
                        );
      if (iVar1 != 0) goto LAB_00155c17;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int cd_raw_set_fixed_value(parser_info *info)
{
    long value_length;

    value_length = decode_escaped_string(info->node->char_data);
    if (value_length < 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid escape sequence in string");
        return -1;
    }
    if (value_length > 0)
    {
        if (coda_type_raw_set_fixed_value((coda_type_raw *)info->node->parent->data, value_length,
                                          info->node->char_data) != 0)
        {
            return -1;
        }
    }

    return 0;
}